

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

bool lsame(char ca,char cb)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000031;
  int iVar3;
  undefined7 in_register_00000039;
  
  bVar1 = true;
  if (ca != cb) {
    iVar2 = (int)CONCAT71(in_register_00000031,cb);
    iVar3 = (int)CONCAT71(in_register_00000039,ca);
    if ((byte)(ca + 0xbfU) < 0x1a) {
      if (iVar2 + -0x20 == iVar3) {
        return true;
      }
    }
    else if ((byte)(ca + 0x9fU) < 0x1a && iVar3 + -0x20 == iVar2) {
      return true;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool lsame ( char ca, char cb )

//****************************************************************************80
//
//  Purpose:
//
//    LSAME returns TRUE if CA is the same letter as CB regardless of case.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, char CA, CB, the characters to compare.
//
//    Output, bool LSAME, is TRUE if the characters are equal,
//    disregarding case.
//
{
  if ( ca == cb )
  {
    return true;
  }

  if ( 'A' <= ca && ca <= 'Z' )
  {
    if ( ca - 'A' == cb - 'a' )
    {
      return true;
    }
  }
  else if ( 'a' <= ca && ca <= 'z' )
  {
    if ( ca - 'a' == cb - 'A' )
    {
      return true;
    }
  }

  return false;
}